

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

void __thiscall re2::CharClassBuilder::RemoveAbove(CharClassBuilder *this,Rune r)

{
  RuneRangeSet *this_00;
  iterator __position;
  RuneRange rr;
  key_type local_38;
  
  if (r < 0x10ffff) {
    if (r < 0x7a) {
      if (r < 0x61) {
        this->lower_ = 0;
        if (r < 0x5a) {
          if (r < 0x41) {
            this->upper_ = 0;
          }
          else {
            this->upper_ = this->upper_ & 0x3ffffffU >> (0x5aU - (char)r & 0x1f);
          }
        }
      }
      else {
        this->lower_ = this->lower_ & 0x3ffffffU >> (0x7aU - (char)r & 0x1f);
      }
    }
    this_00 = &this->ranges_;
    while( true ) {
      local_38.hi = 0x10ffff;
      local_38.lo = r + 1;
      __position = std::
                   _Rb_tree<re2::RuneRange,_re2::RuneRange,_std::_Identity<re2::RuneRange>,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
                   ::find(&this_00->_M_t,&local_38);
      if ((_Rb_tree_header *)__position._M_node ==
          &(this->ranges_)._M_t._M_impl.super__Rb_tree_header) break;
      local_38.lo = __position._M_node[1]._M_color;
      local_38.hi = *(Rune *)&__position._M_node[1].field_0x4;
      std::
      _Rb_tree<re2::RuneRange,re2::RuneRange,std::_Identity<re2::RuneRange>,re2::RuneRangeLess,std::allocator<re2::RuneRange>>
      ::erase_abi_cxx11_((_Rb_tree<re2::RuneRange,re2::RuneRange,std::_Identity<re2::RuneRange>,re2::RuneRangeLess,std::allocator<re2::RuneRange>>
                          *)this_00,(const_iterator)__position._M_node);
      this->nrunes_ = this->nrunes_ + ~local_38.hi + local_38.lo;
      if (local_38.lo <= r) {
        local_38.hi = r;
        std::
        _Rb_tree<re2::RuneRange,re2::RuneRange,std::_Identity<re2::RuneRange>,re2::RuneRangeLess,std::allocator<re2::RuneRange>>
        ::_M_insert_unique<re2::RuneRange_const&>
                  ((_Rb_tree<re2::RuneRange,re2::RuneRange,std::_Identity<re2::RuneRange>,re2::RuneRangeLess,std::allocator<re2::RuneRange>>
                    *)this_00,&local_38);
        this->nrunes_ = (local_38.hi - local_38.lo) + this->nrunes_ + 1;
      }
    }
  }
  return;
}

Assistant:

void CharClassBuilder::RemoveAbove(Rune r) {
  if (r >= Runemax)
    return;

  if (r < 'z') {
    if (r < 'a')
      lower_ = 0;
    else
      lower_ &= AlphaMask >> ('z' - r);
  }

  if (r < 'Z') {
    if (r < 'A')
      upper_ = 0;
    else
      upper_ &= AlphaMask >> ('Z' - r);
  }

  for (;;) {

    iterator it = ranges_.find(RuneRange(r + 1, Runemax));
    if (it == end())
      break;
    RuneRange rr = *it;
    ranges_.erase(it);
    nrunes_ -= rr.hi - rr.lo + 1;
    if (rr.lo <= r) {
      rr.hi = r;
      ranges_.insert(rr);
      nrunes_ += rr.hi - rr.lo + 1;
    }
  }
}